

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::anon_unknown_1::IOBlock::glslTraverseBasicType
          (string *__return_storage_ptr__,IOBlock *this,int indentationDepth,
          BasicTypeVisitFunc visit)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  int local_1a4;
  ostringstream local_1a0 [4];
  int i;
  ostringstream result;
  BasicTypeVisitFunc visit_local;
  int indentationDepth_local;
  IOBlock *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  local_1a4 = 0;
  while( true ) {
    iVar1 = local_1a4;
    sVar2 = std::
            vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
            ::size(&this->m_members);
    if ((int)sVar2 <= iVar1) break;
    std::operator+(&local_208,&this->m_interfaceName,".");
    pvVar3 = std::
             vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
             ::operator[](&this->m_members,(long)local_1a4);
    std::operator+(&local_1e8,&local_208,&pvVar3->name);
    pvVar3 = std::
             vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
             ::operator[](&this->m_members,(long)local_1a4);
    glslTraverseBasicTypes(&local_1c8,&local_1e8,&pvVar3->type,0,indentationDepth,visit);
    std::operator<<((ostream *)local_1a0,(string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    local_1a4 = local_1a4 + 1;
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string IOBlock::glslTraverseBasicType (const int indentationDepth, BasicTypeVisitFunc visit) const
{
	std::ostringstream result;
	for (int i = 0; i < static_cast<int>(m_members.size()); ++i)
		result << glslTraverseBasicTypes(m_interfaceName + "." + m_members[i].name, m_members[i].type, 0, indentationDepth, visit);
	return result.str();
}